

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O2

bool expect_context_not_null(handcrafted_file_type hft)

{
  bool bVar1;
  
  if ((int)hft < 1000) {
    return 799 < (int)hft;
  }
  if (hft < 2000) {
    bVar1 = hft < HANDCRAFTED_KV_SUCCESS;
  }
  else if (hft < 3000) {
    bVar1 = hft < HANDCRAFTED_TENSORS_SUCCESS;
  }
  else {
    bVar1 = hft < HANDCRAFTED_DATA_SUCCESS;
  }
  return !bVar1;
}

Assistant:

static bool expect_context_not_null(const enum handcrafted_file_type hft) {
    if (hft < offset_has_kv) {
        return hft >= HANDCRAFTED_HEADER_EMPTY;
    }
    if (hft < offset_has_tensors) {
        return hft >= HANDCRAFTED_KV_SUCCESS;
    }
    if (hft < offset_has_data) {
        return hft >= HANDCRAFTED_TENSORS_SUCCESS;
    }
    return hft >= HANDCRAFTED_DATA_SUCCESS;
}